

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

ParserResult * __thiscall
Catch::clara::detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clauswilke[P]pinetree/tests/./lib/catch.hpp:9754:33)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_clauswilke[P]pinetree_tests___lib_catch_hpp:9754:33)>
          *this,string *arg)

{
  int iVar1;
  time_t tVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  string local_80;
  undefined **local_60;
  undefined8 local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  ::std::__cxx11::string::_M_assign((string *)&local_80);
  local_58 = 0;
  local_60 = &PTR__BasicResult_001a87c0;
  local_48 = 0;
  local_40[0] = 0;
  local_50 = local_40;
  iVar1 = ::std::__cxx11::string::compare((char *)&local_80);
  if (iVar1 == 0) {
    tVar2 = time((time_t *)0x0);
    ((this->m_lambda).config)->rngSeed = (uint)tVar2;
    *(undefined8 *)
     &(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
      super_ResultBase.m_type = 0;
    (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001a87c0;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
    (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
    (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
  }
  else {
    convertInto<unsigned_int>(__return_storage_ptr__,&local_80,&((this->m_lambda).config)->rngSeed);
  }
  local_60 = &PTR__BasicResult_001a87c0;
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const &arg ) -> ParserResult override {
            return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>( m_lambda, arg );
        }